

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http1.c
# Opt level: O1

int write_header(FIOBJ o,void *w_)

{
  ulong uVar1;
  char cVar2;
  FIOBJ FVar3;
  fiobj_object_vtable_s *pfVar4;
  uint uVar5;
  void *in_RCX;
  uint uVar6;
  _func_int_FIOBJ_void_ptr *extraout_RDX;
  _func_int_FIOBJ_void_ptr *extraout_RDX_00;
  _func_int_FIOBJ_void_ptr *task;
  uint uVar7;
  fio_str_info_s name;
  fio_str_info_s str;
  fio_str_info_s local_58;
  fio_str_info_s local_38;
  
  if (o == 0) {
    return 0;
  }
  FVar3 = fiobj_hash_key_in_loop();
  task = extraout_RDX;
  if (FVar3 != 0) {
    FVar3 = fiobj_hash_key_in_loop();
    *(FIOBJ *)((long)w_ + 8) = FVar3;
    task = extraout_RDX_00;
  }
  uVar7 = (uint)o & 6;
  if ((uVar7 != 6 && (o & 1) == 0) && (*(char *)(o & 0xfffffffffffffff8) == ')')) {
    fiobj_each1(o,(size_t)w_,task,in_RCX);
    return 0;
  }
  uVar1 = *(ulong *)((long)w_ + 8);
  if (uVar1 == 0) {
LAB_0012d15b:
    local_58.data = anon_var_dwarf_1dd;
    local_58.len._0_4_ = 4;
    goto LAB_0012d16e;
  }
  if ((uVar1 & 1) == 0) {
    uVar5 = (uint)uVar1 & 6;
    cVar2 = '(';
    switch(uVar5) {
    case 0:
switchD_0012d12a_caseD_0:
      cVar2 = *(char *)(uVar1 & 0xfffffffffffffff8);
      break;
    case 4:
switchD_0012d12a_caseD_4:
      cVar2 = '*';
      break;
    case 6:
      if ((char)uVar1 == '&') {
        local_58.data = anon_var_dwarf_1e8;
        local_58.len._0_4_ = 5;
      }
      else {
        uVar6 = (uint)uVar1 & 0xff;
        if (uVar6 != 0x16) {
          if (uVar6 == 6) goto LAB_0012d15b;
          switch(uVar5) {
          case 0:
            goto switchD_0012d12a_caseD_0;
          case 4:
            goto switchD_0012d12a_caseD_4;
          case 6:
            cVar2 = (char)uVar1;
          }
          break;
        }
        local_58.data = anon_var_dwarf_1f3;
        local_58.len._0_4_ = 4;
      }
LAB_0012d16e:
      local_58.capa._0_4_ = 0;
      local_58.capa._4_4_ = 0;
      local_58.len._4_4_ = 0;
      goto LAB_0012d208;
    }
    switch(cVar2) {
    case '\'':
      pfVar4 = &FIOBJECT_VTABLE_FLOAT;
      break;
    case '(':
      pfVar4 = &FIOBJECT_VTABLE_STRING;
      break;
    case ')':
      pfVar4 = &FIOBJECT_VTABLE_ARRAY;
      break;
    case '*':
      pfVar4 = &FIOBJECT_VTABLE_HASH;
      break;
    case '+':
      pfVar4 = &FIOBJECT_VTABLE_DATA;
      break;
    default:
      pfVar4 = &FIOBJECT_VTABLE_NUMBER;
    }
    (*pfVar4->to_str)(&local_58,uVar1);
  }
  else {
    fio_ltocstr(&local_58,(long)uVar1 >> 1);
  }
LAB_0012d208:
  if ((o & 1) != 0) {
    fio_ltocstr(&local_38,(long)o >> 1);
    goto LAB_0012d304;
  }
  cVar2 = '(';
  switch(uVar7) {
  case 0:
switchD_0012d21e_caseD_0:
    cVar2 = *(char *)(o & 0xfffffffffffffff8);
    break;
  case 4:
switchD_0012d21e_caseD_4:
    cVar2 = '*';
    break;
  case 6:
    if ((char)o == '&') {
      local_38.data = anon_var_dwarf_1e8;
      local_38.len._0_4_ = 5;
    }
    else {
      uVar5 = (uint)o & 0xff;
      if (uVar5 == 0x16) {
        local_38.data = anon_var_dwarf_1f3;
        local_38.len._0_4_ = 4;
      }
      else {
        if (uVar5 != 6) {
          switch(uVar7) {
          case 0:
            goto switchD_0012d21e_caseD_0;
          case 4:
            goto switchD_0012d21e_caseD_4;
          case 6:
            cVar2 = (char)o;
          }
          break;
        }
        local_38.data = anon_var_dwarf_1dd;
        local_38.len._0_4_ = 4;
      }
    }
    local_38.capa._0_4_ = 0;
    local_38.capa._4_4_ = 0;
    local_38.len._4_4_ = 0;
    goto LAB_0012d304;
  }
  switch(cVar2) {
  case '\'':
    pfVar4 = &FIOBJECT_VTABLE_FLOAT;
    break;
  case '(':
    pfVar4 = &FIOBJECT_VTABLE_STRING;
    break;
  case ')':
    pfVar4 = &FIOBJECT_VTABLE_ARRAY;
    break;
  case '*':
    pfVar4 = &FIOBJECT_VTABLE_HASH;
    break;
  case '+':
    pfVar4 = &FIOBJECT_VTABLE_DATA;
    break;
  default:
    pfVar4 = &FIOBJECT_VTABLE_NUMBER;
  }
  (*pfVar4->to_str)(&local_38,o);
LAB_0012d304:
  if (local_38.data != (char *)0x0) {
    fiobj_str_write(*w_,local_58.data,CONCAT44(local_58.len._4_4_,(undefined4)local_58.len));
    fiobj_str_write(*w_,":",1);
    fiobj_str_write(*w_,local_38.data,CONCAT44(local_38.len._4_4_,(undefined4)local_38.len));
    fiobj_str_write(*w_,"\r\n",2);
  }
  return 0;
}

Assistant:

static int write_header(FIOBJ o, void *w_) {
  struct header_writer_s *w = w_;
  if (!o)
    return 0;
  if (fiobj_hash_key_in_loop()) {
    w->name = fiobj_hash_key_in_loop();
  }
  if (FIOBJ_TYPE_IS(o, FIOBJ_T_ARRAY)) {
    fiobj_each1(o, 0, write_header, w);
    return 0;
  }
  fio_str_info_s name = fiobj_obj2cstr(w->name);
  fio_str_info_s str = fiobj_obj2cstr(o);
  if (!str.data)
    return 0;
  // fiobj_str_capa_assert(w->dest,
  //                       fiobj_obj2cstr(w->dest).len + name.len + str.len +
  //                       5);
  fiobj_str_write(w->dest, name.data, name.len);
  fiobj_str_write(w->dest, ":", 1);
  fiobj_str_write(w->dest, str.data, str.len);
  fiobj_str_write(w->dest, "\r\n", 2);
  return 0;
}